

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::importpubkey(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff4b8;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f0;
  UniValue *in_stack_fffffffffffff4f8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff500;
  RPCArgOptions *in_stack_fffffffffffff508;
  string *in_stack_fffffffffffff510;
  Fallback *in_stack_fffffffffffff518;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff528;
  RPCArg *in_stack_fffffffffffff530;
  RPCResults *in_stack_fffffffffffff538;
  RPCResult *this_00;
  _Alloc_hider in_stack_fffffffffffff600;
  RPCResults *in_stack_fffffffffffff608;
  undefined8 in_stack_fffffffffffff610;
  undefined8 in_stack_fffffffffffff618;
  string *in_stack_fffffffffffff620;
  pointer this_01;
  allocator<char> local_9ba;
  allocator<char> local_9b9 [27];
  allocator<char> local_99e [2];
  allocator<char> local_99c;
  allocator<char> local_99b;
  allocator<char> local_99a;
  allocator<char> local_999 [8];
  allocator<char> local_991 [31];
  allocator<char> local_972;
  allocator<char> local_971 [145];
  RPCMethodImpl *in_stack_fffffffffffff720;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  local_999[1] = (allocator<char>)0x0;
  local_999[2] = (allocator<char>)0x0;
  local_999[3] = (allocator<char>)0x0;
  local_999[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4c8,&in_stack_fffffffffffff4c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::string(in_stack_fffffffffffff4d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4b8);
  RPCArg::RPCArg(in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                 (Type)((ulong)in_stack_fffffffffffff520 >> 0x20),in_stack_fffffffffffff518,
                 in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            ((UniValue *)in_stack_fffffffffffff500,(char (*) [1])in_stack_fffffffffffff4f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::string(in_stack_fffffffffffff4d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4b8);
  RPCArg::RPCArg(in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                 (Type)((ulong)in_stack_fffffffffffff520 >> 0x20),in_stack_fffffffffffff518,
                 in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  local_99e[1] = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff4f8,(bool *)in_stack_fffffffffffff4f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::string(in_stack_fffffffffffff4d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4b8);
  RPCArg::RPCArg(in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                 (Type)((ulong)in_stack_fffffffffffff520 >> 0x20),in_stack_fffffffffffff518,
                 in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff518 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff4b8);
  __l._M_len = (size_type)in_stack_fffffffffffff508;
  __l._M_array = in_stack_fffffffffffff500;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4f8,__l,
             (allocator_type *)in_stack_fffffffffffff4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  this_01 = (pointer)0x0;
  this_00 = (RPCResult *)&stack0xfffffffffffff628;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4b8);
  RPCResult::RPCResult
            (this_00,(Type)((ulong)in_stack_fffffffffffff538 >> 0x20),
             &in_stack_fffffffffffff530->m_names,in_stack_fffffffffffff528,in_stack_fffffffffffff520
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff538,(RPCResult *)in_stack_fffffffffffff530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  HelpExampleCli(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::operator+((char *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  std::operator+(in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  HelpExampleCli(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::operator+(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::operator+(in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (allocator<char> *)in_stack_fffffffffffff4f8);
  HelpExampleRpc(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::operator+(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff4b8,(string *)0xc08e93);
  this = (RPCArg *)&stack0xfffffffffffff600;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::importpubkey()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff4c8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff4c0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_01,in_stack_fffffffffffff620,(string *)in_stack_fffffffffffff618,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff610,
             in_stack_fffffffffffff608,(RPCExamples *)in_stack_fffffffffffff600._M_p,
             in_stack_fffffffffffff720);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff622);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff623);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff624);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff625);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff626);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff627);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4c8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9b9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_99e);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_99c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_99b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_99a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_999);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_991);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_972);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_971);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importpubkey()
{
    return RPCHelpMan{"importpubkey",
                "\nAdds a public key (in hex) that can be watched as if it were in your wallet but cannot be used to spend. Requires a new wallet backup.\n"
                "Hint: use importmulti to import more than one public key.\n"
            "\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\n"
            "may report that the imported pubkey exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\n"
            "The rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\n"
            "but the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\n"
            "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
            "Note: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n",
                {
                    {"pubkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The hex-encoded public key"},
                    {"label", RPCArg::Type::STR, RPCArg::Default{""}, "An optional label"},
                    {"rescan", RPCArg::Type::BOOL, RPCArg::Default{true}, "Scan the chain and mempool for wallet transactions."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nImport a public key with rescan\n"
            + HelpExampleCli("importpubkey", "\"mypubkey\"") +
            "\nImport using a label without rescan\n"
            + HelpExampleCli("importpubkey", "\"mypubkey\" \"testing\" false") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("importpubkey", "\"mypubkey\", \"testing\", false")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    const std::string strLabel{LabelFromValue(request.params[1])};

    // Whether to perform rescan after import
    bool fRescan = true;
    if (!request.params[2].isNull())
        fRescan = request.params[2].get_bool();

    if (fRescan && pwallet->chain().havePruned()) {
        // Exit early and print an error.
        // If a block is pruned after this check, we will import the key(s),
        // but fail the rescan with a generic error.
        throw JSONRPCError(RPC_WALLET_ERROR, "Rescan is disabled when blocks are pruned");
    }

    WalletRescanReserver reserver(*pwallet);
    if (fRescan && !reserver.reserve()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
    }

    CPubKey pubKey = HexToPubKey(request.params[0].get_str());

    {
        LOCK(pwallet->cs_wallet);

        std::set<CScript> script_pub_keys;
        for (const auto& dest : GetAllDestinationsForKey(pubKey)) {
            script_pub_keys.insert(GetScriptForDestination(dest));
        }

        pwallet->MarkDirty();

        pwallet->ImportScriptPubKeys(strLabel, script_pub_keys, /*have_solving_data=*/true, /*apply_label=*/true, /*timestamp=*/1);

        pwallet->ImportPubKeys({{pubKey.GetID(), false}}, {{pubKey.GetID(), pubKey}} , /*key_origins=*/{}, /*add_keypool=*/false, /*timestamp=*/1);
    }
    if (fRescan)
    {
        RescanWallet(*pwallet, reserver);
        pwallet->ResubmitWalletTransactions(/*relay=*/false, /*force=*/true);
    }

    return UniValue::VNULL;
},
    };
}